

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O1

vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
* __thiscall
adios2::core::engine::ssc::SscReaderGeneric::BlocksInfo
          (vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
           *__return_storage_ptr__,SscReaderGeneric *this,VariableStruct *variable,size_t step)

{
  pointer pBVar1;
  size_t __n;
  iterator __position;
  pointer pBVar2;
  size_t sVar3;
  int iVar4;
  pointer pvVar5;
  long lVar6;
  size_t sVar7;
  BlockInfo *v;
  pointer pBVar8;
  
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar5 = (this->m_GlobalWritePattern).
           super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_GlobalWritePattern).
                              super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5) >> 3) *
          -0x55555555) {
    lVar6 = 0;
    sVar7 = 0;
    do {
      pBVar1 = *(pointer *)
                ((long)&pvVar5[lVar6].
                        super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                        ._M_impl.super__Vector_impl_data + 8);
      for (pBVar8 = pvVar5[lVar6].
                    super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start; pBVar8 != pBVar1; pBVar8 = pBVar8 + 1
          ) {
        __n = (pBVar8->name)._M_string_length;
        if (__n == *(size_t *)(variable + 0x10)) {
          if (__n != 0) {
            iVar4 = bcmp((pBVar8->name)._M_dataplus._M_p,*(void **)(variable + 8),__n);
            if (iVar4 != 0) goto LAB_00148e21;
          }
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
            ::_M_realloc_insert<>(__return_storage_ptr__,__position);
          }
          else {
            memset(__position._M_current,0,0xd0);
            (__position._M_current)->MemSpace = Host;
            (__return_storage_ptr__->
            super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
            )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          pBVar2 = (__return_storage_ptr__->
                   super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    (&pBVar2[-1].Start,&pBVar8->start);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    (&pBVar2[-1].Count,&pBVar8->count);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    (&pBVar2[-1].Shape,&pBVar8->shape);
          sVar3 = (this->super_SscReaderBase).m_CurrentStep;
          pBVar2[-1].Step = sVar3;
          pBVar2[-1].StepsStart = sVar3;
          pBVar2[-1].StepsCount = 1;
          pBVar2[-1].WriterID = (int)lVar6;
          pBVar2[-1].BlockID = sVar7;
          if (*(int *)((this->super_SscReaderBase).m_IO + 0x58) != 0) {
            pBVar2[-1].IsReverseDims = true;
          }
          sVar7 = sVar7 + 1;
        }
LAB_00148e21:
      }
      lVar6 = lVar6 + 1;
      pvVar5 = (this->m_GlobalWritePattern).
               super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar6 < (int)((ulong)((long)(this->m_GlobalWritePattern).
                                         super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5)
                          >> 3) * -0x55555555);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VariableStruct::BPInfo> SscReaderGeneric::BlocksInfo(const VariableStruct &variable,
                                                                 const size_t step) const
{
    std::vector<VariableStruct::BPInfo> ret;
    size_t blockID = 0;
    for (int i = 0; i < static_cast<int>(m_GlobalWritePattern.size()); ++i)
    {
        for (auto &v : m_GlobalWritePattern[i])
        {
            if (v.name == variable.m_Name)
            {
                ret.emplace_back();
                auto &b = ret.back();
                b.Start = v.start;
                b.Count = v.count;
                b.Shape = v.shape;
                b.Step = m_CurrentStep;
                b.StepsStart = m_CurrentStep;
                b.StepsCount = 1;
                b.WriterID = i;
                b.BlockID = blockID;
                if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
                {
                    b.IsReverseDims = true;
                }
                ++blockID;
            }
        }
    }
    return ret;
}